

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O0

Object<int> * __thiscall
cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<int>::
Bind<std::function<cmCMakePresetsGraph::ReadFileResult(int&,Json::Value_const*)>>
          (Object<int> *this,string_view *name,
          function<cmCMakePresetsGraph::ReadFileResult_(int_&,_const_Json::Value_*)> *func,
          bool required)

{
  Object<int> *pOVar1;
  function<cmCMakePresetsGraph::ReadFileResult_(int_&,_const_Json::Value_*)> local_48;
  byte local_21;
  function<cmCMakePresetsGraph::ReadFileResult_(int_&,_const_Json::Value_*)> *pfStack_20;
  bool required_local;
  function<cmCMakePresetsGraph::ReadFileResult_(int_&,_const_Json::Value_*)> *func_local;
  string_view *name_local;
  Object<int> *this_local;
  
  local_21 = required;
  pfStack_20 = func;
  func_local = (function<cmCMakePresetsGraph::ReadFileResult_(int_&,_const_Json::Value_*)> *)name;
  name_local = (string_view *)this;
  std::function<cmCMakePresetsGraph::ReadFileResult_(int_&,_const_Json::Value_*)>::function
            (&local_48,func);
  pOVar1 = BindPrivate(this,name,&local_48,(bool)(local_21 & 1));
  std::function<cmCMakePresetsGraph::ReadFileResult_(int_&,_const_Json::Value_*)>::~function
            (&local_48);
  return pOVar1;
}

Assistant:

Object& Bind(const cm::string_view& name, F func, bool required = true)
    {
      return this->BindPrivate(name, MemberFunction(func), required);
    }